

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_pex.cpp
# Opt level: O1

void __thiscall
libtorrent::(anonymous_namespace)::ut_pex_peer_plugin::tick(ut_pex_peer_plugin *this)

{
  anon_unknown_6::ut_pex_peer_plugin::tick((ut_pex_peer_plugin *)(this + -0x38));
  return;
}

Assistant:

void tick() override
		{
			// no handshake yet
			if (!m_message_index) return;

			time_point const now = aux::time_now();
			if (now - seconds(60) < m_last_msg)
			{
#ifndef TORRENT_DISABLE_LOGGING
//				m_pc.peer_log(peer_log_alert::info, "PEX", "waiting: %d seconds to next msg"
//					, int(total_seconds(seconds(60) - (now - m_last_msg))));
#endif
				return;
			}
			int const num_peers = m_torrent.num_peers();
			if (num_peers <= 1) return;

			m_last_msg = now;

			if (m_first_time)
			{
				send_ut_peer_list();
				m_first_time = false;
			}
			else
			{
				send_ut_peer_diff();
			}
		}